

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O2

void cb_OK(Fl_Button *param_1,void *param_2)

{
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  
  Fl_Preferences::Fl_Preferences(&prefs,SYSTEM,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&opt_prefs,&prefs,"options");
  if (opt[0][1] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"ArrowFocus");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"ArrowFocus",opt[0][1]);
  }
  if (opt[1][1] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"VisibleFocus");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"VisibleFocus",opt[1][1]);
  }
  if (opt[2][1] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"DNDText");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"DNDText",opt[2][1]);
  }
  if (opt[3][1] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"ShowTooltips");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"ShowTooltips",opt[3][1]);
  }
  if (opt[4][1] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"FNFCUsesGTK");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"FNFCUsesGTK",opt[4][1]);
  }
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&opt_prefs);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&prefs);
  Fl_Preferences::Fl_Preferences(&prefs,USER,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&opt_prefs,&prefs,"options");
  if (opt[0][0] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"ArrowFocus");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"ArrowFocus",opt[0][0]);
  }
  if (opt[1][0] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"VisibleFocus");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"VisibleFocus",opt[1][0]);
  }
  if (opt[2][0] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"DNDText");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"DNDText",opt[2][0]);
  }
  if (opt[3][0] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"ShowTooltips");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"ShowTooltips",opt[3][0]);
  }
  if (opt[4][0] == 2) {
    Fl_Preferences::deleteEntry(&opt_prefs,"FNFCUsesGTK");
  }
  else {
    Fl_Preferences::set(&opt_prefs,"FNFCUsesGTK",opt[4][0]);
  }
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&opt_prefs);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&prefs);
  (*(global_settings_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return;
}

Assistant:

static void writePrefs() {
  // write all preferences using the array
  {
    Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    if (opt[Fl::OPTION_ARROW_FOCUS][1]==2) opt_prefs.deleteEntry("ArrowFocus");
    else opt_prefs.set("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][1]);
    if (opt[Fl::OPTION_VISIBLE_FOCUS][1]==2) opt_prefs.deleteEntry("VisibleFocus");
    else opt_prefs.set("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][1]);
    if (opt[Fl::OPTION_DND_TEXT][1]==2) opt_prefs.deleteEntry("DNDText");
    else opt_prefs.set("DNDText", opt[Fl::OPTION_DND_TEXT][1]);
    if (opt[Fl::OPTION_SHOW_TOOLTIPS][1]==2) opt_prefs.deleteEntry("ShowTooltips");
    else opt_prefs.set("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][1]);
    if (opt[Fl::OPTION_FNFC_USES_GTK][1]==2) opt_prefs.deleteEntry("FNFCUsesGTK");
    else opt_prefs.set("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK][1]);
  }
  {
    Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    if (opt[Fl::OPTION_ARROW_FOCUS][0]==2) opt_prefs.deleteEntry("ArrowFocus");
    else opt_prefs.set("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][0]);
    if (opt[Fl::OPTION_VISIBLE_FOCUS][0]==2) opt_prefs.deleteEntry("VisibleFocus");
    else opt_prefs.set("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][0]);
    if (opt[Fl::OPTION_DND_TEXT][0]==2) opt_prefs.deleteEntry("DNDText");
    else opt_prefs.set("DNDText", opt[Fl::OPTION_DND_TEXT][0]);
    if (opt[Fl::OPTION_SHOW_TOOLTIPS][0]==2) opt_prefs.deleteEntry("ShowTooltips");
    else opt_prefs.set("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][0]);
    if (opt[Fl::OPTION_FNFC_USES_GTK][0]==2) opt_prefs.deleteEntry("FNFCUsesGTK");
    else opt_prefs.set("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK][0]);
  }
}